

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::ComputeObjectFilenames
          (cmLocalUnixMakefileGenerator3 *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  bool bVar1;
  pointer ppVar2;
  string local_68;
  bool local_41;
  cmSourceFile *pcStack_40;
  bool keptSourceExtension;
  cmSourceFile *sf;
  _Self local_30;
  iterator si;
  char *custom_ext;
  cmGeneratorTarget *gt_local;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mapping_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  si._M_node = (_Base_ptr)cmGeneratorTarget::GetCustomObjectExtension(gt);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(mapping);
  while( true ) {
    sf = (cmSourceFile *)
         std::
         map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(mapping);
    bVar1 = std::operator!=(&local_30,(_Self *)&sf);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    pcStack_40 = ppVar2->first;
    cmLocalGenerator::GetObjectFileNameWithoutTarget
              (&local_68,(cmLocalGenerator *)this,pcStack_40,&gt->ObjectDirectory,&local_41,
               (char *)si._M_node);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    std::__cxx11::string::operator=((string *)&ppVar2->second,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::
    _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  // Determine if these object files should use a custom extension
  char const* custom_ext = gt->GetCustomObjectExtension();
  for (std::map<cmSourceFile const*, std::string>::iterator si =
         mapping.begin();
       si != mapping.end(); ++si) {
    cmSourceFile const* sf = si->first;
    bool keptSourceExtension;
    si->second = this->GetObjectFileNameWithoutTarget(
      *sf, gt->ObjectDirectory, &keptSourceExtension, custom_ext);
  }
}